

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall
Alg::opimb_approx(Alg *this,Graph *graph,double budget,
                 vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                 int mode)

{
  uint uVar1;
  TResult *pTVar2;
  bool bVar3;
  HyperGraph *this_00;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t numSamples;
  Graph *graph_00;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double timeb;
  char local_181;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  undefined1 local_158 [16];
  int local_13c;
  double local_138;
  undefined8 uStack_130;
  double local_120;
  double local_118;
  vector<double,_std::allocator<double>_> *local_110;
  double local_108;
  double local_100;
  int local_f4;
  ulong local_f0;
  double local_e8;
  Nodelist *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  Nodelist *local_a8;
  Nodelist *local_a0;
  long local_98;
  double local_90;
  double local_88;
  double local_80;
  HyperGraph *local_78;
  HyperGraph *local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_158._8_8_ = local_158._0_8_;
  local_178 = delta;
  local_160 = epsilon;
  local_118 = budget;
  local_110 = budget_list;
  local_98 = std::chrono::_V2::system_clock::now();
  local_180 = 6.0 / local_178;
  dVar17 = log(local_180);
  if (dVar17 < 0.0) {
    local_158._0_8_ = sqrt(dVar17);
  }
  else {
    local_158._0_8_ = SQRT(dVar17);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,local_110);
  iVar5 = cal_k_max(&local_48,local_118);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,local_110);
  cal_k_min(&local_60,local_118);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  dVar17 = (double)this->__numV;
  local_138 = dVar17 + dVar17;
  uStack_130 = 0;
  local_168 = (double)iVar5;
  local_170 = log(dVar17);
  dVar17 = log(local_180);
  dVar17 = (local_170 * local_168 + dVar17) * local_160;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar18 = (double)local_158._0_8_ * local_160;
  local_158._0_8_ = dVar18;
  dVar17 = dVar17 + dVar18;
  dVar18 = (double)this->__numV;
  dVar17 = (local_138 * dVar17 * dVar17) / dVar18;
  local_f0 = (ulong)dVar17;
  local_f0 = (long)(dVar17 - 9.223372036854776e+18) & (long)local_f0 >> 0x3f | local_f0;
  local_138 = dVar18 + dVar18;
  uStack_130 = 0;
  local_170 = log(dVar18);
  dVar17 = log(local_180);
  dVar17 = (local_170 * local_168 + dVar17) * local_160;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar17 = (local_138 * ((double)local_158._0_8_ + dVar17) * ((double)local_158._0_8_ + dVar17)) /
           (local_160 * local_160 * local_168);
  uVar9 = (ulong)dVar17;
  local_170 = 0.0;
  uVar9 = ((long)(dVar17 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9) / local_f0;
  auVar13._8_4_ = (int)(uVar9 >> 0x20);
  auVar13._0_8_ = uVar9;
  auVar13._12_4_ = 0x45300000;
  dVar17 = log((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
  uVar9 = (ulong)(dVar17 / 0.6931471805599453);
  local_68 = ((long)(dVar17 / 0.6931471805599453 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f |
             uVar9) + 1;
  auVar14._8_4_ = (int)((ulong)local_68 >> 0x20);
  auVar14._0_8_ = local_68;
  auVar14._12_4_ = 0x45300000;
  dVar18 = auVar14._8_8_ - 1.9342813113834067e+25;
  dVar17 = ((dVar18 + ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) * 3.0) /
           local_178;
  local_158._8_4_ = SUB84(dVar18,0);
  local_158._0_8_ = dVar17;
  local_158._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_120 = log(dVar17);
  local_100 = log((double)local_158._0_8_);
  local_d0 = 0.0;
  local_70 = &this->__hyperG;
  local_78 = &this->__hyperGVldt;
  local_e0 = &this->__vecSeed;
  local_80 = (local_120 + local_120) / 9.0;
  local_e8 = local_120 * 0.5;
  local_120 = local_120 / 18.0;
  local_100 = local_100 * 0.5;
  local_a0 = &this->__vecSeed_inf;
  local_a8 = &this->__vecSeed_inf_cost;
  local_88 = SQRT(local_e8);
  local_90 = SQRT(local_100);
  local_178 = 0.0;
  local_180 = 0.0;
  local_f4 = 0;
  local_13c = mode;
  do {
    dVar17 = local_170;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    numSamples = local_f0 << (SUB81(dVar17,0) & 0x3f);
    local_138 = (double)std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_70,numSamples);
    this_00 = local_78;
    HyperGraph::build_n_RRsets(local_78,numSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    graph_00 = (Graph *)(ulong)(uint)(int)cVar4;
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    this->__numRRsets = (this->__hyperG).__numRRsets;
    lVar7 = std::chrono::_V2::system_clock::now();
    local_168 = max_cover_lazy_budget(this,graph_00,local_118,local_110,&local_d0,mode);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_d8 = HyperGraph::self_inf_cal(this_00,local_e0);
    auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar15._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar15._12_4_ = 0x45300000;
    dStack_c0 = auVar15._8_8_ - 1.9342813113834067e+25;
    local_108 = local_168 / local_160;
    dVar17 = local_108;
    if (mode == 2) {
      if (this->__is_inf_cost == true) {
        if (this->__boundMin_inf_cost <= local_108) {
          dVar17 = this->__boundMin_inf_cost;
        }
      }
      else {
        dVar17 = this->__boundMin_inf;
      }
    }
    else if (mode == 1) {
      dVar17 = this->__boundLast_inf;
      if (this->__boundLast_inf <= this->__boundLast_inf_cost) {
        dVar17 = this->__boundLast_inf_cost;
      }
    }
    local_158._0_8_ = dVar17;
    local_c8 = ((dStack_c0 + (auVar15._0_8_ - 4503599627370496.0)) * local_d8) /
               (double)this->__numV + local_80;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"========upper bound ratio: ",0x1b);
    poVar6 = std::ostream::_M_insert<double>((double)local_158._0_8_ / local_108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"========",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar16._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar16._12_4_ = 0x45300000;
    local_b8 = auVar16._0_8_ - 4503599627370496.0;
    dStack_b0 = auVar16._8_8_ - 1.9342813113834067e+25;
    uVar1 = this->__numV;
    if (local_c8 < 0.0) {
      local_c8 = sqrt(local_c8);
    }
    else {
      local_c8 = SQRT(local_c8);
    }
    uVar11 = SUB84(local_88,0);
    uVar12 = (undefined4)((ulong)local_88 >> 0x20);
    if (local_e8 < 0.0) {
      dVar17 = sqrt(local_e8);
      uVar11 = SUB84(dVar17,0);
      uVar12 = (undefined4)((ulong)dVar17 >> 0x20);
    }
    local_108 = (double)CONCAT44(uVar12,uVar11);
    dVar17 = ((dStack_b0 + local_b8) * (double)local_158._0_8_) / (double)uVar1 + local_100;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    mode = local_13c;
    uVar11 = SUB84(local_90,0);
    uVar12 = (undefined4)((ulong)local_90 >> 0x20);
    if (local_100 < 0.0) {
      local_b8 = dVar17;
      dVar17 = sqrt(local_100);
      uVar11 = SUB84(dVar17,0);
      uVar12 = (undefined4)((ulong)dVar17 >> 0x20);
      dVar17 = local_b8;
    }
    dVar17 = dVar17 + (double)CONCAT44(uVar12,uVar11);
    local_180 = local_180 + (double)(lVar7 - (long)local_138) / 1000000000.0;
    local_178 = local_178 + (double)(lVar8 - lVar7) / 1000000000.0;
    dVar18 = (local_c8 - local_108) * (local_c8 - local_108) - local_120;
    local_138 = 0.0;
    if (0.0 <= dVar18) {
      local_138 = dVar18;
    }
    local_138 = local_138 / (dVar17 * dVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-B-APPROX (",0x13);
    lVar7 = (long)local_170 + 1;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") approx. (max-cover): ",0x17);
    poVar6 = std::ostream::_M_insert<double>(local_138);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    poVar6 = std::ostream::_M_insert<double>(local_168 / (double)local_158._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"), #RR sets: ",0xd);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    local_181 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_181,1);
    bVar3 = local_138 < local_160;
    bVar10 = local_f4 != 1;
    if (bVar10 || bVar3) {
      iVar5 = local_f4;
      if (local_f4 == 0) {
        iVar5 = 1;
      }
      local_170 = (double)lVar7;
      if (local_160 <= local_138) {
        local_f4 = iVar5;
      }
    }
    else {
      pTVar2 = this->__tRes;
      pTVar2->__Approx = local_138;
      lVar7 = std::chrono::_V2::system_clock::now();
      pTVar2->__RunningTime = (double)(lVar7 - local_98) / 1000000000.0;
      pTVar2 = this->__tRes;
      pTVar2->__Influence = local_d8;
      pTVar2->__InfluenceOriginal = local_168;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&pTVar2->__VecSeed,local_e0);
      pTVar2->__SeedSize =
           (int)((ulong)((long)(this->__vecSeed).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->__vecSeed).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->__tRes->__VecSeed_inf,local_a0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->__tRes->__VecSeed_inf_cost,local_a8);
      pTVar2 = this->__tRes;
      pTVar2->__BoundMin_inf = this->__boundMin_inf;
      pTVar2->__BoundMin_inf_cost = this->__boundMin_inf_cost;
      pTVar2->__RRsetsSize = this->__numRRsets * 2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
      poVar6 = std::ostream::_M_insert<double>(local_d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", time: ",8);
      poVar6 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
      local_181 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_181,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
      poVar6 = std::ostream::_M_insert<double>(local_180);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      local_158._0_8_ = local_d0;
      poVar6 = std::ostream::_M_insert<double>(local_178 - local_d0);
      local_181 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_181,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
      poVar6 = std::ostream::_M_insert<double>((double)local_158._0_8_);
      local_181 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_181,1);
      local_f4 = 1;
    }
  } while (bVar10 || bVar3);
  return 0.0;
}

Assistant:

double Alg::opimb_approx(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-APPROX");
    const double approx = epsilon;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-APPROX (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}